

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O2

SQRex * sqstd_rex_compile(SQChar *pattern,SQChar **error)

{
  int iVar1;
  SQRex *exp_00;
  size_t sVar2;
  SQRexNode *pSVar3;
  SQInteger SVar4;
  void *pvVar5;
  SQRexMatch *pSVar6;
  SQRex *exp;
  
  exp_00 = (SQRex *)sq_malloc(0x68);
  exp_00->_bol = (SQChar *)0x0;
  exp_00->_eol = (SQChar *)0x0;
  exp_00->_p = pattern;
  sVar2 = strlen(pattern);
  exp_00->_nallocated = sVar2;
  pSVar3 = (SQRexNode *)sq_malloc(exp_00->_nallocated << 5);
  exp_00->_nodes = pSVar3;
  exp_00->_nsize = 0;
  exp_00->_matches = (SQRexMatch *)0x0;
  exp_00->_nsubexpr = 0;
  SVar4 = sqstd_rex_newnode(exp_00,0x102);
  exp_00->_first = SVar4;
  exp_00->_error = error;
  pvVar5 = (void *)sq_malloc(200);
  exp_00->_jmpbuf = pvVar5;
  iVar1 = _setjmp((__jmp_buf_tag *)exp_00->_jmpbuf);
  if (iVar1 == 0) {
    SVar4 = sqstd_rex_list(exp_00);
    exp_00->_nodes[exp_00->_first].left = SVar4;
    if (*exp_00->_p != '\0') {
      sqstd_rex_error(exp_00,"unexpected character");
    }
    pSVar6 = (SQRexMatch *)sq_malloc(exp_00->_nsubexpr << 4);
    exp_00->_matches = pSVar6;
    memset(exp_00->_matches,0,exp_00->_nsubexpr << 4);
  }
  else {
    sqstd_rex_free(exp_00);
    exp_00 = (SQRex *)0x0;
  }
  return exp_00;
}

Assistant:

SQRex *sqstd_rex_compile(const SQChar *pattern,const SQChar **error)
{
    SQRex * volatile exp = (SQRex *)sq_malloc(sizeof(SQRex)); // "volatile" is needed for setjmp()
    exp->_eol = exp->_bol = NULL;
    exp->_p = pattern;
    exp->_nallocated = (SQInteger)scstrlen(pattern) * sizeof(SQChar);
    exp->_nodes = (SQRexNode *)sq_malloc(exp->_nallocated * sizeof(SQRexNode));
    exp->_nsize = 0;
    exp->_matches = 0;
    exp->_nsubexpr = 0;
    exp->_first = sqstd_rex_newnode(exp,OP_EXPR);
    exp->_error = error;
    exp->_jmpbuf = sq_malloc(sizeof(jmp_buf));
    if(setjmp(*((jmp_buf*)exp->_jmpbuf)) == 0) {
        SQInteger res = sqstd_rex_list(exp);
        exp->_nodes[exp->_first].left = res;
        if(*exp->_p!='\0')
            sqstd_rex_error(exp,_SC("unexpected character"));
#ifdef _DEBUG
        {
            SQInteger nsize,i;
            SQRexNode *t;
            nsize = exp->_nsize;
            t = &exp->_nodes[0];
            scprintf(_SC("\n"));
            for(i = 0;i < nsize; i++) {
                if(exp->_nodes[i].type>MAX_CHAR)
                    scprintf(_SC("[%02d] %10s "), (SQInt32)i,g_nnames[exp->_nodes[i].type-MAX_CHAR]);
                else
                    scprintf(_SC("[%02d] %10c "), (SQInt32)i,exp->_nodes[i].type);
                scprintf(_SC("left %02d right %02d next %02d\n"), (SQInt32)exp->_nodes[i].left, (SQInt32)exp->_nodes[i].right, (SQInt32)exp->_nodes[i].next);
            }
            scprintf(_SC("\n"));
        }
#endif
        exp->_matches = (SQRexMatch *) sq_malloc(exp->_nsubexpr * sizeof(SQRexMatch));
        memset(exp->_matches,0,exp->_nsubexpr * sizeof(SQRexMatch));
    }
    else{
        sqstd_rex_free(exp);
        return NULL;
    }
    return exp;
}